

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wipe.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_1fcfc::circle_out_wiper::play(circle_out_wiper *this)

{
  iterator __first;
  iterator __last;
  const_iterator begin;
  const_iterator end;
  undefined1 local_28 [8];
  vector<coord,_std::allocator<coord>_> coords;
  circle_out_wiper *this_local;
  
  coords.super__Vector_base<coord,_std::allocator<coord>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  anon_unknown.dwarf_1fcfc::wiper::limit_coords
            ((vector<coord,_std::allocator<coord>_> *)local_28,&this->super_wiper);
  __first = std::vector<coord,_std::allocator<coord>_>::begin
                      ((vector<coord,_std::allocator<coord>_> *)local_28);
  __last = std::vector<coord,_std::allocator<coord>_>::end
                     ((vector<coord,_std::allocator<coord>_> *)local_28);
  std::
  sort<__gnu_cxx::__normal_iterator<coord*,std::vector<coord,std::allocator<coord>>>,(anonymous_namespace)::circle_out_wiper::play()::__0>
            ((__normal_iterator<coord_*,_std::vector<coord,_std::allocator<coord>_>_>)
             __first._M_current,
             (__normal_iterator<coord_*,_std::vector<coord,_std::allocator<coord>_>_>)
             __last._M_current,(anon_class_8_1_8991fb9c)this);
  begin = std::vector<coord,_std::allocator<coord>_>::cbegin
                    ((vector<coord,_std::allocator<coord>_> *)local_28);
  end = std::vector<coord,_std::allocator<coord>_>::cend
                  ((vector<coord,_std::allocator<coord>_> *)local_28);
  anon_unknown.dwarf_1fcfc::wiper::clear_coords
            (&this->super_wiper,(It)begin._M_current,(It)end._M_current);
  std::vector<coord,_std::allocator<coord>_>::~vector
            ((vector<coord,_std::allocator<coord>_> *)local_28);
  return;
}

Assistant:

void circle_out_wiper::play()
{
    std::vector<coord> coords = limit_coords();
    std::sort(coords.begin(), coords.end(),
        [this](const coord &lhs, const coord &rhs) {
            int d1 = distance(lhs, m_opts);
            int d2 = distance(rhs, m_opts);
            if (d1 < d2)
            {
                return true;
            }
            if (d1 == d2)
            {
                if (lhs.row < rhs.row)
                {
                    return true;
                }
                if (lhs.row == rhs.row)
                {
                    return lhs.col < rhs.col;
                }
            }
            return false;
        });
    clear_coords(coords.cbegin(), coords.cend());
}